

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.h
# Opt level: O0

void __thiscall FTerrainTypeArray::Set(FTerrainTypeArray *this,int index,int value)

{
  uint uVar1;
  unsigned_short *puVar2;
  int oldsize;
  int value_local;
  int index_local;
  FTerrainTypeArray *this_local;
  
  uVar1 = TArray<unsigned_short,_unsigned_short>::Size(&this->Types);
  if (uVar1 <= (uint)index) {
    uVar1 = TArray<unsigned_short,_unsigned_short>::Size(&this->Types);
    Resize(this,index + 1);
    puVar2 = TArray<unsigned_short,_unsigned_short>::operator[](&this->Types,(long)(int)uVar1);
    memset(puVar2,0xff,(long)(int)((index + 1) - uVar1) << 1);
  }
  puVar2 = TArray<unsigned_short,_unsigned_short>::operator[](&this->Types,(long)index);
  *puVar2 = (unsigned_short)value;
  return;
}

Assistant:

void Set(int index, int value)
	{
		if ((unsigned)index >= Types.Size())
		{
			int oldsize = Types.Size();
			Resize(index + 1);
			memset(&Types[oldsize], 0xff, (index + 1 - oldsize)*sizeof(WORD));
		}
		Types[index] = value;
	}